

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O2

void __thiscall
duckdb::FunctionSet<duckdb::ScalarFunction>::~FunctionSet(FunctionSet<duckdb::ScalarFunction> *this)

{
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&(this->functions).
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit FunctionSet(string name) : name(std::move(name)) {
	}